

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

int __thiscall CGlyphMap::GetCharGlyph(CGlyphMap *this,int Chr,FT_Face_conflict *pFace)

{
  int iVar1;
  FT_Face_conflict *ppFVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)Chr;
  iVar1 = FT_Get_Char_Index(this->m_DefaultFace,lVar4);
  *pFace = this->m_DefaultFace;
  if (iVar1 == 0 && this->m_DefaultFace != (FT_Face_conflict)0x0) {
    if ((this->m_VariantFace != (FT_Face_conflict)0x0) &&
       (iVar1 = FT_Get_Char_Index(this->m_VariantFace,lVar4), iVar1 != 0)) {
      ppFVar2 = &this->m_VariantFace;
LAB_00130ec1:
      *pFace = *ppFVar2;
      return iVar1;
    }
    if (0 < this->m_NumFallbackFaces) {
      ppFVar2 = this->m_aFallbackFaces;
      lVar3 = 0;
      do {
        if ((*ppFVar2 != (FT_Face_conflict)0x0) &&
           (iVar1 = FT_Get_Char_Index(*ppFVar2,lVar4), iVar1 != 0)) goto LAB_00130ec1;
        lVar3 = lVar3 + 1;
        ppFVar2 = ppFVar2 + 1;
      } while (lVar3 < this->m_NumFallbackFaces);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CGlyphMap::GetCharGlyph(int Chr, FT_Face *pFace)
{
	int GlyphIndex = FT_Get_Char_Index(m_DefaultFace, (FT_ULong)Chr);
	*pFace = m_DefaultFace;

	if(!m_DefaultFace || GlyphIndex)
		return GlyphIndex;

	if(m_VariantFace)
	{
		GlyphIndex = FT_Get_Char_Index(m_VariantFace, (FT_ULong)Chr);
		if(GlyphIndex)
		{
			*pFace = m_VariantFace;
			return GlyphIndex;
		}
	}

	for(int i = 0; i < m_NumFallbackFaces; ++i)
	{
		if(m_aFallbackFaces[i])
		{
			GlyphIndex = FT_Get_Char_Index(m_aFallbackFaces[i], (FT_ULong)Chr);
			if(GlyphIndex)
			{
				*pFace = m_aFallbackFaces[i];
				return GlyphIndex;
			}
		}
	}

	return 0;
}